

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O3

void mat_postmult_diag(csc *A,c_float *d)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  c_float *pcVar4;
  long lVar5;
  long lVar6;
  
  lVar1 = A->n;
  if (0 < lVar1) {
    plVar2 = A->p;
    lVar5 = 0;
    lVar6 = *plVar2;
    do {
      lVar3 = plVar2[lVar5 + 1];
      if (lVar6 < lVar3) {
        pcVar4 = A->x;
        do {
          pcVar4[lVar6] = d[lVar5] * pcVar4[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar3 != lVar6);
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar3;
    } while (lVar5 != lVar1);
  }
  return;
}

Assistant:

void mat_postmult_diag(csc *A, const c_float *d) {
  c_int j, i;

  for (j = 0; j < A->n; j++) {                // Cycle over columns j
    for (i = A->p[j]; i < A->p[j + 1]; i++) { // Cycle every row i in column j
      A->x[i] *= d[j];                        // Scale by corresponding element
                                              // of d for column j
    }
  }
}